

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O1

void __thiscall GraphContigger::extend_to_repeats(GraphContigger *this,int max_size)

{
  sgNodeID_t sVar1;
  pointer pLVar2;
  pointer pLVar3;
  uint64_t uVar4;
  pointer pLVar5;
  pointer this_00;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> through;
  NodeView nv;
  sgNodeID_t fwn;
  GraphEditor ge;
  vector<LinkView,_std::allocator<LinkView>_> local_238;
  vector<LinkView,_std::allocator<LinkView>_> local_220;
  vector<LinkView,_std::allocator<LinkView>_> local_208;
  vector<NodeView,_std::allocator<NodeView>_> local_1f0;
  NodeView local_1d8;
  NodeView *local_1c0;
  NodeView *local_1b8;
  ulong local_1b0;
  sgNodeID_t local_1a8;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_1a0;
  vector<NodeView,_std::allocator<NodeView>_> local_188;
  vector<LinkView,_std::allocator<LinkView>_> local_170;
  sgNodeID_t local_158;
  DistanceGraph *pDStack_150;
  NodeView local_148;
  NodeView local_138;
  NodeView local_128;
  GraphEditor local_118;
  
  GraphEditor::GraphEditor(&local_118,*(WorkSpace **)this);
  DistanceGraph::get_all_nodeviews(&local_1f0,*(DistanceGraph **)this,false,true);
  local_1c0 = local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar7 = (ulong)max_size;
    this_00 = local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1b0 = uVar7;
    do {
      local_158 = this_00->id;
      pDStack_150 = this_00->dg;
      local_1b8 = this_00;
      local_148 = NodeView::rc(this_00);
      lVar8 = 0;
      do {
        local_1d8.id = *(sgNodeID_t *)((long)&local_158 + lVar8);
        local_1d8.dg = *(DistanceGraph **)((long)&pDStack_150 + lVar8);
        uVar4 = NodeView::size(&local_1d8);
        if (uVar4 <= uVar7) {
          NodeView::prev(&local_238,&local_1d8);
          bVar10 = true;
          if (1 < (ulong)(((long)local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333)) {
            NodeView::next(&local_170,&local_1d8);
            bVar10 = (long)local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl
                           .super__Vector_impl_data._M_start != 0x28;
            if (local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_170.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_170.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_170.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
          if (local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar10) {
            NodeView::next(&local_238,&local_1d8);
            sVar1 = ((local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                      super__Vector_impl_data._M_start)->node_view).id;
            operator_delete(local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1a8 = sVar1;
            NodeView::prev(&local_208,&local_1d8);
            pLVar3 = local_208.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (local_208.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_208.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar10 = false;
            }
            else {
              pLVar2 = local_208.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                       super__Vector_impl_data._M_start;
              bVar6 = false;
              do {
                pLVar5 = pLVar2 + 1;
                local_128.id = (pLVar2->node_view).id;
                local_128.dg = (pLVar2->node_view).dg;
                NodeView::next(&local_220,&local_128);
                bVar9 = true;
                if ((ulong)(((long)local_220.super__Vector_base<LinkView,_std::allocator<LinkView>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_220.super__Vector_base<LinkView,_std::allocator<LinkView>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333) < 2) {
                  local_138.id = (pLVar2->node_view).id;
                  local_138.dg = (pLVar2->node_view).dg;
                  NodeView::parallels(&local_188,&local_138);
                  bVar9 = 0x10 < (ulong)((long)local_188.
                                               super__Vector_base<NodeView,_std::allocator<NodeView>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_188.
                                              super__Vector_base<NodeView,_std::allocator<NodeView>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                  if (local_188.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_188.
                                    super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_188.
                                          super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_188.
                                          super__Vector_base<NodeView,_std::allocator<NodeView>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if (local_220.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_220.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_220.
                                        super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_220.
                                        super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                bVar10 = true;
                if (!bVar9) {
                  local_220.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)-(pLVar2->node_view).id;
                  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                  emplace_back<long,long&>
                            ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                             &local_238,(long *)&local_220,&local_1a8);
                  bVar10 = bVar6;
                }
                uVar7 = local_1b0;
                pLVar2 = pLVar5;
                bVar6 = bVar10;
              } while (!(bool)(bVar9 | pLVar5 == pLVar3));
            }
            if (local_208.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_208.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_208.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_208.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            sVar1 = local_1d8.id;
            if (!bVar10) {
              std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
                        (&local_1a0,
                         (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         &local_238);
              GraphEditor::queue_node_expansion(&local_118,sVar1,&local_1a0);
              if (local_1a0.
                  super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_1a0.
                                super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_1a0.
                                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_1a0.
                                      super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_238.super__Vector_base<LinkView,_std::allocator<LinkView>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_238.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_238.
                                    super__Vector_base<LinkView,_std::allocator<LinkView>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
          }
        }
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x20);
      this_00 = local_1b8 + 1;
    } while (this_00 != local_1c0);
  }
  if (local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
      super__Vector_impl_data._M_start != (NodeView *)0x0) {
    operator_delete(local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<NodeView,_std::allocator<NodeView>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  GraphEditor::apply_all(&local_118);
  GraphEditor::~GraphEditor(&local_118);
  return;
}

Assistant:

void GraphContigger::extend_to_repeats(int max_size) {
    GraphEditor ge(ws);
    for (auto &fnv:ws.sdg.get_all_nodeviews()){
        for (auto nv:{fnv,fnv.rc()} ){
            if (nv.size()>max_size) continue;
            if (nv.prev().size()<2 or nv.next().size()!=1) continue;
            auto fwn=nv.next()[0].node().node_id();
            bool b=false;
            std::vector<std::pair<sgNodeID_t ,sgNodeID_t >> through;
            for (auto &lp:nv.prev()){
                if (lp.node().next().size()>1 or lp.node().parallels().size()>1){
                    b=true;
                    break;
                }
                through.emplace_back(-lp.node().node_id(),fwn);
            }
            if (b) continue;

            ge.queue_node_expansion(nv.node_id(),through);
        }
    }
    ge.apply_all();
//    def collapse_into_inputs(g,e, max_collapsed_size=500):
//    """Finds all nodes representing only shared sequence at the end of previous nodes, collapses back, only queues operations"""
//    for nvf in g.get_all_nodeviews():
//        for nv in [nvf,nvf.rc()]:
//            if nv.size()>max_collapsed_size: continue #don't expand large nodes
//            if len(nv.prev())<=1 or len(nv.next())!=1: continue
//            b=False
//            for lp in nv.prev():
//                if len(lp.node().next())>1 or len(lp.node().parallels())>1: #a single conflicted prev node skips the expansion, could be solved partially?
//                    b=True
//                    break#don't expand after a bubble
//            if b: continue
//            #TODO: tip check? is it even needed now?
//            #print([[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
//            e.queue_node_expansion(nv.node_id(),[[-x.node().node_id(), nv.next()[0].node().node_id()] for x in nv.prev()])
}